

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patrol_strategy.cpp
# Opt level: O0

void __thiscall
PatrolStrategy::generateActions(PatrolStrategy *this,PlayerSight *sight,Actions *actions)

{
  undefined4 uVar1;
  Randomizer *pRVar2;
  float fVar3;
  float fVar4;
  Vec2 local_78;
  Vec2 local_70;
  Vec2 local_68;
  Vec2 local_60;
  Vec2 local_58;
  Vec2 local_50;
  Vec2 local_48;
  Vec2 local_40;
  Vec2 local_38;
  Vec2 local_30;
  Vec2 local_28;
  Actions *local_20;
  Actions *actions_local;
  PlayerSight *sight_local;
  PatrolStrategy *this_local;
  
  if ((this->field_0xc & 1) == 0) {
    local_20 = actions;
    actions_local = (Actions *)sight;
    sight_local = (PlayerSight *)this;
    if (sight->round == 1) {
      pRVar2 = Randomizer::getInstance();
      fVar3 = Randomizer::randXAxis(pRVar2);
      this->currentTarget = (int)fVar3 % 5;
    }
    if (*(int *)actions_local % 0x28 == 1) {
      this->currentTarget = this->currentTarget + 1 + ((this->currentTarget + 1) / 5) * -5;
      pRVar2 = Randomizer::getInstance();
      fVar3 = Randomizer::randXAxis(pRVar2);
      pRVar2 = Randomizer::getInstance();
      fVar4 = Randomizer::randYAxis(pRVar2);
      Vec2::Vec2(&local_28,(fVar3 * 4.0) / 60.0 - 2.0,(fVar4 * 4.0) / 90.0 - 2.0);
      this->goal = local_28;
      switch(this->currentTarget) {
      case 0:
        Vec2::Vec2(&local_38,27.0,82.0);
        local_30 = Vec2::operator+(&this->goal,&local_38);
        this->goal = local_30;
        break;
      case 1:
        Vec2::Vec2(&local_48,16.0,46.0);
        local_40 = Vec2::operator+(&this->goal,&local_48);
        this->goal = local_40;
        break;
      case 2:
        Vec2::Vec2(&local_58,23.0,7.0);
        local_50 = Vec2::operator+(&this->goal,&local_58);
        this->goal = local_50;
        break;
      case 3:
        Vec2::Vec2(&local_68,40.0,55.0);
        local_60 = Vec2::operator+(&this->goal,&local_68);
        this->goal = local_60;
        break;
      case 4:
        Vec2::Vec2(&local_78,55.0,84.0);
        local_70 = Vec2::operator+(&this->goal,&local_78);
        this->goal = local_70;
        break;
      default:
        uVar1 = *(undefined4 *)&actions_local->field_0xc;
        (this->goal).x = (float)*(undefined4 *)&actions_local->field_0x8;
        (this->goal).y = (float)uVar1;
      }
      Actions::emplace(local_20,SelectDestination,*(int *)&actions_local->field_0x4,this->goal);
    }
  }
  return;
}

Assistant:

void PatrolStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    if (sight.round == 1)
        currentTarget = (int)(Randomizer::getInstance()->randXAxis()) % 5;
    if (sight.round % 40 != 1)
        return;
    currentTarget = (currentTarget + 1) % 5;
    goal = Vec2(Randomizer::getInstance()->randXAxis() * 4 / MapWidth - 2,
                Randomizer::getInstance()->randYAxis() * 4 / MapHeight - 2);
    switch (currentTarget)
    {
        case 0:
            goal = goal + Vec2(27, 82);
            break;
        case 1:
            goal = goal + Vec2(16, 46);
            break;
        case 2:
            goal = goal + Vec2(23, 7);
            break;
        case 3:
            goal = goal + Vec2(40, 55);
            break;
        case 4:
            goal = goal + Vec2(55, 84);
            break;
        default:
            goal = sight.pos;
    }
    actions->emplace(SelectDestination, sight.id, goal);
}